

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O1

void phyr::ParallelFor(function<void_(long)> *func,int64_t count,int chunkSize)

{
  _Manager_type p_Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  _func_void *p_Var5;
  ulong uVar6;
  ParallelForLoop loop;
  unique_lock<std::mutex> lock;
  ulong local_e0;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  ulong local_98;
  int local_90;
  ulong local_88;
  int local_80;
  _Any_data *local_78;
  int local_70;
  unique_lock<std::mutex> local_68;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  if ((count < chunkSize) || (threads == DAT_001b0c38)) {
    if (0 < count) {
      p_Var5 = (_func_void *)0x0;
      do {
        local_d8._M_unused._M_function_pointer = p_Var5;
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00129498;
        (*func->_M_invoker)((_Any_data *)func,(long *)local_d8._M_pod_data);
        p_Var5 = p_Var5 + 1;
      } while ((_func_void *)count != p_Var5);
    }
  }
  else {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (_Manager_type)0x0;
    local_c0 = func->_M_invoker;
    p_Var1 = (func->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor
      ;
      local_58._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
      local_48 = p_Var1;
    }
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (_Manager_type)0x0;
    p_Stack_40 = local_c0;
    if (local_48 != (_Manager_type)0x0) {
      local_d8._M_unused._M_object = local_58._M_unused._M_object;
      local_d8._8_8_ = local_58._8_8_;
      local_c8 = local_48;
      local_48 = (_Manager_type)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
    }
    local_a8 = (code *)0x0;
    pcStack_a0 = (code *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = (_Any_data *)0x0;
    local_70 = -1;
    local_98 = count;
    local_90 = chunkSize;
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)workListMutex);
    if (iVar2 != 0) goto LAB_0012949d;
    local_78 = workList;
    workList = &local_d8;
    pthread_mutex_unlock((pthread_mutex_t *)workListMutex);
    local_68._M_device = (mutex_type *)workListMutex;
    local_68._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_68);
    local_68._M_owns = true;
    std::condition_variable::notify_all();
    iVar2 = local_80;
    if ((long)local_88 < (long)local_98 || local_80 != 0) {
      local_80 = local_80 + 1;
      uVar6 = local_88;
      do {
        uVar3 = (long)local_90 + uVar6;
        uVar4 = uVar3;
        if ((long)local_98 < (long)uVar3) {
          uVar4 = local_98;
        }
        if ((long)local_98 <= (long)uVar3) {
          workList = local_78;
        }
        local_88 = uVar4;
        std::unique_lock<std::mutex>::unlock(&local_68);
        if ((long)uVar6 < (long)uVar4) {
          do {
            if (local_c8 == (_Manager_type)0x0) {
              local_e0 = (long)uVar6 % (long)local_70 & 0xffffffffU |
                         (long)uVar6 / (long)local_70 << 0x20;
              if (local_a8 == (code *)0x0) {
                std::__throw_bad_function_call();
                goto LAB_00129498;
              }
              (*pcStack_a0)(&local_b8,&local_e0);
            }
            else {
              local_e0 = uVar6;
              (*local_c0)(&local_d8,(long *)&local_e0);
            }
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        std::unique_lock<std::mutex>::lock(&local_68);
        uVar6 = local_88;
        iVar2 = local_80 + -1;
      } while ((long)local_88 < (long)local_98 || local_80 + -1 != 0);
    }
    local_80 = iVar2;
    std::unique_lock<std::mutex>::~unique_lock(&local_68);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,3);
    }
    if (local_c8 != (_Manager_type)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
  }
  return;
LAB_00129498:
  iVar2 = std::__throw_bad_function_call();
LAB_0012949d:
  std::__throw_system_error(iVar2);
}

Assistant:

void ParallelFor(std::function<void(int64_t)> func, int64_t count, int chunkSize) {
    ASSERT(threads.size() > 0 || maxThreadIndex() == 1);

    // Run iterations immediately if not using threads or if _count_ is small
    if (threads.empty() || count < chunkSize) {
        for (int64_t i = 0; i < count; ++i) func(i);
        return;
    }

    // Create and enqueue _ParallelForLoop_ for this loop
    ParallelForLoop loop(std::move(func), count, chunkSize);
    workListMutex.lock();
    loop.next = workList;
    workList = &loop;
    workListMutex.unlock();

    // Notify worker threads of work to be done
    std::unique_lock<std::mutex> lock(workListMutex);
    workListCondition.notify_all();

    // Help out with parallel loop iterations in the current thread
    while (!loop.finished()) {
        // Run a chunk of loop iterations for _loop_

        // Find the set of loop iterations to run next
        int64_t indexStart = loop.nextIndex;
        int64_t indexEnd = std::min(indexStart + loop.chunkSize, loop.maxIndex);

        // Update _loop_ to reflect iterations this thread will run
        loop.nextIndex = indexEnd;
        if (loop.nextIndex == loop.maxIndex) workList = loop.next;
        loop.activeWorkers++;

        // Run loop indices in _[indexStart, indexEnd)_
        lock.unlock();
        for (int64_t index = indexStart; index < indexEnd; ++index) {
            if (loop.func1D) {
                loop.func1D(index);
            }
            // Handle other types of loops
            else {
                ASSERT(loop.func2D);
                loop.func2D(Point2i(index % loop.nX, index / loop.nX));
            }
        }
        lock.lock();

        // Update _loop_ to reflect completion of iterations
        loop.activeWorkers--;
    }
}